

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

int ggml::cpu::aarch64::repack<block_q4_0,8l,8l>(ggml_tensor *t,void *data,size_t data_size)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  undefined8 *puVar12;
  undefined1 (*pauVar13) [64];
  long lVar14;
  undefined1 (*pauVar15) [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  block_q4_0 dst_tmp [8];
  block_q4_0x8 out;
  undefined1 local_148 [16];
  ushort auStack_138 [10];
  ushort local_124;
  ushort local_112;
  ushort local_100;
  ushort local_ee;
  ushort local_dc;
  ushort local_ca;
  undefined1 local_b8 [16];
  undefined1 auStack_a8 [48];
  undefined1 local_78 [16];
  undefined1 auStack_68 [48];
  undefined1 auStack_38 [16];
  
  if (t->type == GGML_TYPE_Q4_0) {
    pauVar13 = (undefined1 (*) [64])t->data;
    iVar2 = ggml_nrows();
    lVar6 = t->ne[0];
    lVar11 = lVar6 + 0x1f;
    if (-1 < lVar6) {
      lVar11 = lVar6;
    }
    iVar5 = (int)(lVar11 >> 5);
    if ((long)(iVar2 * iVar5) * 0x12 == data_size) {
      iVar3 = -1;
      if ((((uint)lVar6 | (uint)t->ne[1]) & 7) == 0) {
        if (0 < iVar2) {
          lVar6 = (long)iVar5;
          uVar9 = 0;
          auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar17 = vpbroadcastq_avx512f(ZEXT816(7));
          auVar18 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar19 = vpbroadcastq_avx512f();
          auVar20 = vpbroadcastq_avx512f(ZEXT816(0x12));
          auVar21 = vpbroadcastq_avx512f(ZEXT816(0x8888888888888888));
          do {
            if (0 < lVar6) {
              lVar11 = 0;
              puVar10 = (undefined8 *)data;
              pauVar15 = pauVar13;
              do {
                lVar14 = 0;
                puVar12 = puVar10;
                do {
                  *(undefined2 *)((long)auStack_138 + lVar14) = *(undefined2 *)(puVar12 + 2);
                  uVar7 = puVar12[1];
                  *(undefined8 *)(local_148 + lVar14) = *puVar12;
                  *(undefined8 *)(local_148 + lVar14 + 8) = uVar7;
                  lVar14 = lVar14 + 0x12;
                  puVar12 = (undefined8 *)((long)puVar12 + lVar6 * 0x12);
                } while (lVar14 != 0x90);
                auVar1 = vpinsrw_avx(local_148,(uint)auStack_138[1],1);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_124,2);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_112,3);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_100,4);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_ee,5);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_dc,6);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_ca,7);
                lVar14 = 2;
                auVar22 = vmovdqa64_avx512f(auVar16);
                do {
                  auVar23 = vpandq_avx512f(auVar22,auVar17);
                  auVar23 = vpmuldq_avx512f(auVar23,auVar20);
                  auVar24 = vpandq_avx512f(auVar22,auVar18);
                  auVar24 = vpaddq_avx512f(auVar19,auVar24);
                  vpaddq_avx512f(auVar24,auVar23);
                  auVar23 = vpgatherqq_avx512f(*(undefined8 *)(uVar9 + 2));
                  auVar23 = vpxorq_avx512f(auVar23,auVar21);
                  auVar23 = vmovdqu64_avx512f(auVar23);
                  *(undefined1 (*) [64])(local_b8 + lVar14 * 8) = auVar23;
                  auVar22 = vpaddq_avx512f(auVar22,auVar18);
                  lVar14 = lVar14 + 8;
                } while (lVar14 != 0x12);
                pauVar13 = (undefined1 (*) [64])(pauVar15[2] + 0x10);
                auVar22._16_48_ = auStack_a8;
                auVar22._0_16_ = auVar1;
                auVar25 = vmovdqu64_avx512f(auVar22);
                auVar23._16_48_ = auStack_68;
                auVar23._0_16_ = local_78;
                auVar23 = vmovdqu64_avx512f(auVar23);
                auVar24._48_16_ = auStack_38;
                auVar24._0_48_ = auStack_68;
                auVar22 = vmovdqu64_avx512f(auVar24);
                auVar22 = vmovdqu64_avx512f(auVar22);
                *(undefined1 (*) [64])(pauVar15[1] + 0x10) = auVar22;
                auVar22 = vmovdqu64_avx512f(auVar23);
                pauVar15[1] = auVar22;
                auVar22 = vmovdqu64_avx512f(auVar25);
                *pauVar15 = auVar22;
                lVar11 = lVar11 + 1;
                puVar10 = (undefined8 *)((long)puVar10 + 0x12);
                pauVar15 = pauVar13;
              } while (lVar11 != lVar6);
            }
            uVar8 = (int)uVar9 + 8;
            uVar9 = (ulong)uVar8;
            data = (void *)((long)data + (long)(iVar5 * 8) * 0x12);
          } while ((int)uVar8 < iVar2);
        }
        iVar3 = 0;
      }
      return iVar3;
    }
    pcVar4 = "data_size == nrow * nblocks * sizeof(block_q4_0)";
    uVar7 = 0x16eb;
  }
  else {
    pcVar4 = "t->type == GGML_TYPE_Q4_0";
    uVar7 = 0x16e1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar7,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

static int repack_q4_0_to_q4_0_8_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_Q4_0);
    GGML_ASSERT(interleave_block == 8);
    constexpr int nrows_interleaved = 8;

    block_q4_0x8 * dst = (block_q4_0x8*)t->data;
    const block_q4_0 * src = (const block_q4_0*) data;
    block_q4_0 dst_tmp[8];
    int nrow = ggml_nrows(t);
    int nblocks = t->ne[0] / QK4_0;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_q4_0));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i  = 0; i < nrows_interleaved; i++ ) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_q4_0x8(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}